

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::Subst_LBackward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  double *pdVar1;
  TPZBaseMatrix *pTVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *x;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  int64_t iVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  int64_t i;
  Fad<double> sum;
  int64_t c;
  int64_t r;
  Fad<double> *in_stack_fffffffffffffed0;
  double *in_stack_fffffffffffffed8;
  Fad<double> *in_stack_fffffffffffffee0;
  Fad<double> *in_stack_ffffffffffffff00;
  Fad<double> *in_stack_ffffffffffffff08;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffff18;
  Fad<double> *in_stack_ffffffffffffff20;
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [64];
  Fad<double> *local_50;
  undefined8 local_48;
  double *local_20;
  Fad<double> *local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  x = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)TPZBaseMatrix::Rows(in_RSI);
  pFVar3 = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)(**(code **)(*in_RDI + 0x60))();
  if (((x != pFVar3) || ((char)in_RDI[3] == '\0')) || ((char)in_RDI[3] != '\x04')) {
    Error(in_stack_000000d0,in_stack_000000c8);
  }
  local_18 = (Fad<double> *)(**(code **)(*in_RDI + 0x60))();
  while (local_18 = (Fad<double> *)((long)&local_18[-1].defaultVal + 7), -1 < (long)local_18) {
    for (local_20 = (double *)0x0; pdVar1 = local_20, iVar4 = TPZBaseMatrix::Cols(local_10),
        (long)pdVar1 < iVar4; local_20 = (double *)((long)local_20 + 1)) {
      local_48 = 0;
      Fad<double>::Fad<double,_nullptr>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      in_stack_fffffffffffffee0 = (Fad<double> *)(**(code **)(*in_RDI + 0x60))();
      local_50 = in_stack_fffffffffffffee0;
      while (pTVar2 = local_10, local_50 = (Fad<double> *)((long)&local_50[-1].defaultVal + 7),
            (long)local_18 < (long)local_50) {
        (**(code **)(*in_RDI + 0x120))(local_90,in_RDI,local_18,local_50);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b0,local_10,local_50,local_20);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        Fad<double>::operator+=(in_stack_ffffffffffffff00,x);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffed0);
        Fad<double>::~Fad(in_stack_fffffffffffffed0);
        Fad<double>::~Fad(in_stack_fffffffffffffed0);
      }
      in_stack_fffffffffffffed0 = local_18;
      in_stack_fffffffffffffed8 = local_20;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(&stack0xffffffffffffff00);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      (*(pTVar2->super_TPZSavable)._vptr_TPZSavable[0x23])
                (pTVar2,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,local_d0);
      Fad<double>::~Fad(in_stack_fffffffffffffed0);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffed0);
      Fad<double>::~Fad(in_stack_fffffffffffffed0);
      Fad<double>::~Fad(in_stack_fffffffffffffed0);
    }
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LBackward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt){
		Error("TPZMatrix::Subst_LBackward incompatible dimensions \n");
	}
	
    for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
        for ( int64_t c = 0; c < B->Cols(); c++ ) {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
            //
            TVar sum = 0.0;
            for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = B[r,c] - sum.
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}